

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngwutil.c
# Opt level: O2

void png_write_sCAL_s(png_structrp png_ptr,int unit,png_const_charp width,png_const_charp height)

{
  size_t sVar1;
  size_t __n;
  ulong length;
  png_byte buf [64];
  png_byte local_78;
  undefined1 local_77;
  undefined1 auStack_76 [70];
  
  sVar1 = strlen(width);
  __n = strlen(height);
  length = __n + sVar1 + 2;
  if (0x40 < length) {
    png_warning(png_ptr,"Can\'t write sCAL (buffer too small)");
    return;
  }
  local_78 = (png_byte)unit;
  memcpy(&local_77,width,sVar1 + 1);
  memcpy(auStack_76 + sVar1,height,__n);
  png_write_complete_chunk(png_ptr,0x7343414c,&local_78,length);
  return;
}

Assistant:

void /* PRIVATE */
png_write_sCAL_s(png_structrp png_ptr, int unit, png_const_charp width,
    png_const_charp height)
{
   png_byte buf[64];
   size_t wlen, hlen, total_len;

   png_debug(1, "in png_write_sCAL_s");

   wlen = strlen(width);
   hlen = strlen(height);
   total_len = wlen + hlen + 2;

   if (total_len > 64)
   {
      png_warning(png_ptr, "Can't write sCAL (buffer too small)");
      return;
   }

   buf[0] = (png_byte)unit;
   memcpy(buf + 1, width, wlen + 1);      /* Append the '\0' here */
   memcpy(buf + wlen + 2, height, hlen);  /* Do NOT append the '\0' here */

   png_debug1(3, "sCAL total length = %u", (unsigned int)total_len);
   png_write_complete_chunk(png_ptr, png_sCAL, buf, total_len);
}